

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O2

Expr xor(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
        int argc)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  Expr EVar5;
  Expr expr;
  Expr expr_00;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar4 = uVar3;
  }
  iVar2 = 0;
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    expr._4_4_ = 0;
    expr.type = *(uint *)((long)&args->type + uVar3);
    expr.field_1.val_atom =
         ((anon_union_8_8_707b72ea_for_Expr_1 *)((long)&args->field_1 + uVar3))->val_atom;
    EVar5 = exec_eval(exec,callContext,expr);
    expr_00.field_1 = EVar5.field_1;
    expr_00._4_4_ = 0;
    expr_00.type = EVar5.type;
    _Var1 = is_true(exec,expr_00);
    iVar2 = iVar2 + (uint)_Var1;
  }
  EVar5._4_4_ = 0;
  EVar5.type = (&exec->nil)[iVar2 == 1].type;
  EVar5.field_1.val_atom = (&exec->nil)[iVar2 == 1].field_1.val_atom;
  return EVar5;
}

Assistant:

BUILTIN_FUNC(xor)
{
    int cnt = 0;
    for (int i = 0; i < argc; i++)
    {
        Expr val = exec_eval(exec, callContext, args[i]);
        if (is_true(exec, val))
            cnt++;
    }
    if (cnt == 1)
        return exec->t;
    else
        return exec->nil;

}